

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O3

uint __thiscall
crnlib::command_line_params::find
          (command_line_params *this,uint num_keys,char **ppKeys,
          vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          *pIterators,vector<unsigned_int> *pUnmatched_indices)

{
  uint *puVar1;
  param_map_const_iterator pVar2;
  uint uVar3;
  param_map_const_iterator pVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  _Self __tmp;
  param_map_const_iterator end;
  param_map_const_iterator local_58;
  param_map_const_iterator local_50;
  ulong local_48;
  command_line_params *local_40;
  char **local_38;
  
  local_38 = ppKeys;
  if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
    uVar7 = (this->m_params).m_size;
    uVar3 = pUnmatched_indices->m_size;
    uVar10 = uVar7;
    if (uVar3 != uVar7) {
      if (uVar3 <= uVar7) {
        if (pUnmatched_indices->m_capacity < uVar7) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pUnmatched_indices,uVar7,uVar3 + 1 == uVar7,4,
                     (object_mover)0x0,false);
          uVar3 = pUnmatched_indices->m_size;
        }
        memset(pUnmatched_indices->m_p + uVar3,0,(ulong)(uVar7 - uVar3) << 2);
        uVar10 = (this->m_params).m_size;
      }
      pUnmatched_indices->m_size = uVar7;
    }
    if (uVar10 != 0) {
      puVar1 = pUnmatched_indices->m_p;
      uVar5 = 0;
      do {
        puVar1[uVar5] = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->m_params).m_size);
    }
  }
  if (num_keys == 0) {
    uVar9 = 0;
  }
  else {
    uVar5 = 0;
    uVar9 = 0;
    local_48 = (ulong)num_keys;
    local_40 = this;
    do {
      local_50._M_node = (_Rb_tree_node_base *)0x0;
      local_58._M_node = (_Rb_tree_node_base *)0x0;
      find(local_40,local_38[uVar5],&local_50,&local_58);
      pVar2._M_node = local_58._M_node;
      for (pVar4._M_node = local_50._M_node; pVar4._M_node != pVar2._M_node;
          pVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar4._M_node)) {
        if (pIterators !=
            (vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
             *)0x0) {
          uVar7 = *(uint *)(pIterators + 8);
          if (*(uint *)(pIterators + 0xc) <= uVar7) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)pIterators,uVar7 + 1,true,8,
                       vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
                       ::object_mover,false);
            uVar7 = *(uint *)(pIterators + 8);
          }
          *(_Base_ptr *)(*(long *)pIterators + (ulong)uVar7 * 8) = pVar4._M_node;
          *(uint *)(pIterators + 8) = uVar7 + 1;
        }
        if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
          uVar7 = pUnmatched_indices->m_size;
          if ((ulong)uVar7 != 0) {
            puVar1 = pUnmatched_indices->m_p;
            lVar8 = (ulong)uVar7 << 2;
            lVar6 = 0;
            do {
              if (pVar4._M_node[2]._M_color == puVar1[lVar6]) {
                if (-1 < (int)lVar6) {
                  if ((int)lVar6 + 1U < uVar7) {
                    puVar1[lVar6] = puVar1[uVar7 - 1];
                    uVar7 = pUnmatched_indices->m_size;
                  }
                  if (uVar7 != 0) {
                    pUnmatched_indices->m_size = uVar7 - 1;
                  }
                }
                break;
              }
              lVar6 = lVar6 + 1;
              lVar8 = lVar8 + -4;
            } while (lVar8 != 0);
          }
        }
        uVar9 = uVar9 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_48);
  }
  return uVar9;
}

Assistant:

uint command_line_params::find(uint num_keys, const char** ppKeys, crnlib::vector<param_map_const_iterator>* pIterators, crnlib::vector<uint>* pUnmatched_indices) const
    {
        CRNLIB_ASSERT(ppKeys);

        if (pUnmatched_indices)
        {
            pUnmatched_indices->resize(m_params.size());
            for (uint i = 0; i < m_params.size(); i++)
            {
                (*pUnmatched_indices)[i] = i;
            }
        }

        uint n = 0;
        for (uint i = 0; i < num_keys; i++)
        {
            const char* pKey = ppKeys[i];

            param_map_const_iterator begin, end;
            find(pKey, begin, end);

            while (begin != end)
            {
                if (pIterators)
                {
                    pIterators->push_back(begin);
                }

                if (pUnmatched_indices)
                {
                    int k = pUnmatched_indices->find(begin->second.m_index);
                    if (k >= 0)
                    {
                        pUnmatched_indices->erase_unordered(k);
                    }
                }

                n++;
                begin++;
            }
        }

        return n;
    }